

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O3

void __thiscall
chrono::turtlebot::Turtlebot_Part::Turtlebot_Part
          (Turtlebot_Part *this,string *name,bool fixed,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChSystem *system,ChVector<double> *body_pos,ChQuaternion<double> *body_rot,
          shared_ptr<chrono::ChBodyAuxRef> *chassis_body,bool collide)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  pointer pcVar3;
  ChBodyAuxRef *pCVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  ChBodyAuxRef *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  long local_68 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ChVector<double> *local_40;
  ChSystem *local_38;
  
  auVar7._8_4_ = 0x3f800000;
  auVar7._0_8_ = 0x3f8000003f800000;
  auVar7._12_4_ = 0x3f800000;
  local_48 = &(this->m_mesh_name).field_2;
  this->_vptr_Turtlebot_Part = (_func_int **)&PTR__Turtlebot_Part_0017f3f0;
  local_50 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_50;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_mesh_name)._M_dataplus._M_p = (pointer)local_48;
  (this->m_mesh_name)._M_string_length = 0;
  (this->m_mesh_name).field_2._M_local_buf[0] = '\0';
  (this->m_offset).m_data[2] = 0.0;
  *(undefined1 (*) [16])(this->m_offset).m_data = ZEXT416(0) << 0x40;
  auVar6 = ZEXT1264(ZEXT812(0));
  uVar1 = vmovlps_avx(auVar7);
  (this->m_color).R = (float)(int)uVar1;
  (this->m_color).G = (float)(int)((ulong)uVar1 >> 0x20);
  (this->m_color).B = 1.0;
  (this->m_rot).m_data[3] = 0.0;
  this->m_chassis = (shared_ptr<chrono::ChBodyAuxRef>)auVar6._0_16_;
  this->m_pos = (ChVector<double>)auVar6._16_24_;
  (this->m_rot).m_data[0] = (double)auVar6._40_8_;
  (this->m_rot).m_data[1] = (double)auVar6._48_8_;
  (this->m_rot).m_data[2] = (double)auVar6._56_8_;
  local_40 = body_pos;
  local_38 = system;
  local_78 = (ChBodyAuxRef *)(**(code **)(*(long *)system + 0x188))(system);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBodyAuxRef*>
            (&_Stack_70,local_78);
  _Var5._M_pi = _Stack_70._M_pi;
  pCVar4 = local_78;
  local_78 = (ChBodyAuxRef *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pCVar4;
  (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    }
  }
  peVar2 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pcVar3 = (name->_M_dataplus)._M_p;
  local_78 = (ChBodyAuxRef *)local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  std::__cxx11::string::_M_assign((string *)(peVar2 + 8));
  if (local_78 != (ChBodyAuxRef *)local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  (this->m_chassis).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (chassis_body->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_chassis).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(chassis_body->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  (this->m_mat).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_mat).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  if (&this->m_pos != local_40) {
    (this->m_pos).m_data[0] = local_40->m_data[0];
    (this->m_pos).m_data[1] = local_40->m_data[1];
    (this->m_pos).m_data[2] = local_40->m_data[2];
  }
  if (&this->m_rot != body_rot) {
    (this->m_rot).m_data[0] = body_rot->m_data[0];
    (this->m_rot).m_data[1] = body_rot->m_data[1];
    (this->m_rot).m_data[2] = body_rot->m_data[2];
    (this->m_rot).m_data[3] = body_rot->m_data[3];
  }
  this->m_system = local_38;
  this->m_collide = collide;
  this->m_fixed = fixed;
  return;
}

Assistant:

Turtlebot_Part::Turtlebot_Part(const std::string& name,
                               bool fixed,
                               std::shared_ptr<ChMaterialSurface> mat,
                               ChSystem* system,
                               const ChVector<>& body_pos,
                               const ChQuaternion<>& body_rot,
                               std::shared_ptr<ChBodyAuxRef> chassis_body,
                               bool collide) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(name + "_body");
    m_chassis = chassis_body;
    m_mat = mat;
    m_pos = body_pos;
    m_rot = body_rot;
    m_system = system;
    m_collide = collide;
    m_fixed = fixed;
}